

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateGarfieldGasTableForLiquidNoble.cpp
# Opt level: O2

int PassConstantBody(ofstream *outFile,string *element)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<((ostream *)outFile," E-B angles");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)outFile," 1.57079633E+00");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)outFile," B fields");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)outFile," 0.00000000E+00");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)outFile," Mixture:");
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar1 = std::operator==(element,"Xe");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 1.00000000E+02 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile,
                             " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)outFile," The gas tables follow:");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)outFile," ");
    iVar2 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "----> NEST cannot currently generate the mixture for your element ");
    poVar3 = std::operator<<(poVar3,(string *)element);
    poVar3 = std::operator<<(poVar3,". Right now, NEST only supports LXe.");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int PassConstantBody(std::ofstream& outFile, std::string element) {
  outFile << " E-B angles" << std::endl;
  outFile << " 1.57079633E+00" << std::endl;
  outFile << " B fields" << std::endl;
  outFile << " 0.00000000E+00" << std::endl;
  outFile << " Mixture:" << std::endl;

  // This is a dumb, hack-y way to do things, but for now, when we are only
  // looking at pure Xe or Ar, it's simpler than trying to use Garfield's
  // mixture codes. But since this code is somewhat modular, one can easily come
  // back and improve this later if it is so desired.
  if (element == "Xe") {
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 1.00000000E+02 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
  } else {
    std::cout
        << "----> NEST cannot currently generate the mixture for your element "
        << element << ". Right now, NEST only supports LXe." << std::endl;
    return -1;
  }

  outFile << " The gas tables follow:" << std::endl;
  outFile << " ";
  return 0;
}